

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Prune(ShardedLRUCache *this)

{
  int local_14;
  int s;
  ShardedLRUCache *this_local;
  
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    LRUCache::Prune(this->shard_ + local_14);
  }
  return;
}

Assistant:

virtual void Prune() {
                for (int s = 0; s < kNumShards; s++) {
                    shard_[s].Prune();
                }
            }